

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O0

NeuralNetwork *
buildBasicNeuralNetworkModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,TensorAttributes *outTensorAttr,
          int numberOfLayers,bool areWeightsQuantized,bool isBiasQuantized)

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  FeatureType *pFVar4;
  InnerProductLayerParams *this;
  WeightParams *pWVar5;
  QuantizationParams *pQVar6;
  LinearQuantizationParams *pLVar7;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar8;
  reference from;
  FeatureDescription *this_00;
  char *local_220;
  char *local_210;
  char *local_200;
  FeatureDescription *trainingInput;
  FeatureDescription feature;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2;
  LinearQuantizationParams *linear_quant_params_1;
  QuantizationParams *quant_params_1;
  WeightParams *bias;
  LinearQuantizationParams *linear_quant_params;
  QuantizationParams *quant_params;
  WeightParams *weights;
  InnerProductLayerParams *innerProductParams;
  undefined1 local_128 [8];
  string output;
  undefined1 local_e8 [8];
  string input;
  undefined1 local_b8 [64];
  NeuralNetworkLayer *local_78;
  NeuralNetworkLayer *layer;
  NeuralNetwork *pNStack_68;
  int i_2;
  NeuralNetwork *neuralNet;
  ArrayFeatureType *pAStack_58;
  int i_1;
  ArrayFeatureType *outTensorShape;
  FeatureDescription *outTensor;
  ArrayFeatureType *pAStack_40;
  int i;
  ArrayFeatureType *inTensorShape;
  FeatureDescription *inTensor;
  bool isBiasQuantized_local;
  bool areWeightsQuantized_local;
  TensorAttributes *pTStack_28;
  int numberOfLayers_local;
  TensorAttributes *outTensorAttr_local;
  TensorAttributes *inTensorAttr_local;
  Model *pMStack_10;
  bool isUpdatable_local;
  Model *m_local;
  
  inTensor._2_1_ = isBiasQuantized;
  inTensor._3_1_ = areWeightsQuantized;
  inTensor._4_4_ = numberOfLayers;
  pTStack_28 = outTensorAttr;
  outTensorAttr_local = inTensorAttr;
  inTensorAttr_local._7_1_ = isUpdatable;
  pMStack_10 = m;
  pMVar3 = CoreML::Specification::Model::mutable_description(m);
  inTensorShape = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_input(pMVar3);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)inTensorShape,outTensorAttr_local->name);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)inTensorShape);
  pAStack_40 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAStack_40,ArrayFeatureType_ArrayDataType_FLOAT32);
  for (outTensor._4_4_ = 0; outTensor._4_4_ < outTensorAttr_local->dimension;
      outTensor._4_4_ = outTensor._4_4_ + 1) {
    CoreML::Specification::ArrayFeatureType::add_shape(pAStack_40,1);
  }
  pMVar3 = CoreML::Specification::Model::mutable_description(pMStack_10);
  outTensorShape = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_output(pMVar3);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)outTensorShape,pTStack_28->name);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)outTensorShape);
  pAStack_58 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAStack_58,ArrayFeatureType_ArrayDataType_FLOAT32);
  for (neuralNet._4_4_ = 0; neuralNet._4_4_ < pTStack_28->dimension;
      neuralNet._4_4_ = neuralNet._4_4_ + 1) {
    CoreML::Specification::ArrayFeatureType::add_shape(pAStack_58,1);
  }
  CoreML::Specification::Model::set_specificationversion(pMStack_10,4);
  pNStack_68 = CoreML::Specification::Model::mutable_neuralnetwork(pMStack_10);
  for (layer._4_4_ = 0; layer._4_4_ < inTensor._4_4_; layer._4_4_ = layer._4_4_ + 1) {
    local_78 = CoreML::Specification::NeuralNetwork::add_layers(pNStack_68);
    std::__cxx11::to_string((string *)local_b8,layer._4_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b8 + 0x20),"inner_layer",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::to_string((string *)&output.super__Rb_tree_node_base._M_right,layer._4_4_ + -1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   "output",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &output.super__Rb_tree_node_base._M_right);
    std::__cxx11::string::~string((string *)&output.super__Rb_tree_node_base._M_right);
    std::__cxx11::to_string((string *)&innerProductParams,layer._4_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   "output",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &innerProductParams);
    std::__cxx11::string::~string((string *)&innerProductParams);
    pNVar1 = local_78;
    if (inTensor._4_4_ == 1) {
      local_200 = "inner_layer";
    }
    else {
      local_200 = (char *)std::__cxx11::string::c_str();
    }
    CoreML::Specification::NeuralNetworkLayer::set_name(pNVar1,local_200);
    pNVar1 = local_78;
    if (layer._4_4_ == 0) {
      local_210 = outTensorAttr_local->name;
    }
    else {
      local_210 = (char *)std::__cxx11::string::c_str();
    }
    CoreML::Specification::NeuralNetworkLayer::add_input(pNVar1,local_210);
    pNVar1 = local_78;
    if (layer._4_4_ == inTensor._4_4_ + -1) {
      local_220 = pTStack_28->name;
    }
    else {
      local_220 = (char *)std::__cxx11::string::c_str();
    }
    CoreML::Specification::NeuralNetworkLayer::add_output(pNVar1,local_220);
    this = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(local_78);
    CoreML::Specification::InnerProductLayerParams::set_inputchannels(this,1);
    CoreML::Specification::InnerProductLayerParams::set_outputchannels(this,1);
    pWVar5 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this);
    if ((inTensor._3_1_ & 1) == 0) {
      CoreML::Specification::WeightParams::add_floatvalue(pWVar5,1.0);
    }
    else {
      pQVar6 = CoreML::Specification::WeightParams::mutable_quantization(pWVar5);
      CoreML::Specification::QuantizationParams::set_numberofbits(pQVar6,1);
      pLVar7 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar6);
      CoreML::Specification::LinearQuantizationParams::add_scale(pLVar7,1.0);
      CoreML::Specification::LinearQuantizationParams::add_bias(pLVar7,0.0);
      CoreML::Specification::WeightParams::set_int8rawvalue(pWVar5,"x01");
    }
    CoreML::Specification::InnerProductLayerParams::set_hasbias(this,true);
    pWVar5 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this);
    if ((inTensor._2_1_ & 1) == 0) {
      CoreML::Specification::WeightParams::add_floatvalue(pWVar5,1.0);
    }
    else {
      pQVar6 = CoreML::Specification::WeightParams::mutable_quantization(pWVar5);
      CoreML::Specification::QuantizationParams::set_numberofbits(pQVar6,1);
      pLVar7 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar6);
      CoreML::Specification::LinearQuantizationParams::add_scale(pLVar7,1.0);
      CoreML::Specification::LinearQuantizationParams::add_bias(pLVar7,0.0);
      CoreML::Specification::WeightParams::set_int8rawvalue(pWVar5,"x01");
    }
    if ((inTensorAttr_local._7_1_ & 1) != 0) {
      CoreML::Specification::NeuralNetworkLayer::set_isupdatable(local_78,true);
      pWVar5 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this);
      CoreML::Specification::WeightParams::set_isupdatable(pWVar5,true);
      pWVar5 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this);
      CoreML::Specification::WeightParams::set_isupdatable(pWVar5,true);
    }
    std::__cxx11::string::~string((string *)local_128);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)(local_b8 + 0x20));
  }
  if ((inTensorAttr_local._7_1_ & 1) != 0) {
    CoreML::Specification::Model::set_isupdatable(pMStack_10,true);
    pMVar3 = CoreML::Specification::Model::description(pMStack_10);
    pRVar8 = CoreML::Specification::ModelDescription::input(pMVar3);
    __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (pRVar8);
    feature._40_8_ =
         google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar8);
    while (bVar2 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                             (&__end2,(iterator *)&feature._cached_size_), bVar2) {
      from = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end2);
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)&trainingInput,from);
      pMVar3 = CoreML::Specification::Model::mutable_description(pMStack_10);
      pRVar8 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar3);
      this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                          (pRVar8);
      CoreML::Specification::FeatureDescription::CopyFrom
                (this_00,(FeatureDescription *)&trainingInput);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)&trainingInput);
      google::protobuf::internal::
      RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end2);
    }
  }
  return pNStack_68;
}

Assistant:

Specification::NeuralNetwork* buildBasicNeuralNetworkModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr, int numberOfLayers, bool areWeightsQuantized, bool isBiasQuantized) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorAttr->name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < outTensorAttr->dimension; i++) {
        outTensorShape->add_shape(1);
    }
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto neuralNet = m.mutable_neuralnetwork();
    
    for (int i = 0; i < numberOfLayers; i++) {
        auto layer = neuralNet->add_layers();
        
        std::string layerName = "inner_layer" + std::to_string(i);
        std::string input = "output" + std::to_string(i-1);
        std::string output = "output" + std::to_string(i);
        
        layer->set_name((numberOfLayers == 1) ? "inner_layer" : layerName.c_str());
        layer->add_input((i == 0) ? inTensorAttr->name : input.c_str());
        layer->add_output((i == numberOfLayers-1) ? outTensorAttr->name : output.c_str());
        
        Specification::InnerProductLayerParams *innerProductParams = layer->mutable_innerproduct();
        innerProductParams->set_inputchannels(1);
        innerProductParams->set_outputchannels(1);

        // set weight
        auto* weights = innerProductParams->mutable_weights();
        if (areWeightsQuantized) {
            auto *quant_params = weights->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            weights->set_int8rawvalue("x01"); // this is [1]
        } else {
            weights->add_floatvalue(1.0);
        }

        // set bias
        innerProductParams->set_hasbias(true);
        auto* bias = innerProductParams->mutable_bias();
        if (isBiasQuantized) {
            auto *quant_params = bias->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            bias->set_int8rawvalue("x01"); // this is [1]
        } else {
            bias->add_floatvalue(1.0);
        }
        
        if (isUpdatable) {
            layer->set_isupdatable(true);
            innerProductParams->mutable_weights()->set_isupdatable(true);
            innerProductParams->mutable_bias()->set_isupdatable(true);
        }
    }
    
    if (isUpdatable) {
        m.set_isupdatable(true);
        
        for (auto feature : m.description().input()) {
            auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
            trainingInput->CopyFrom(feature);
        }
    }
    
    return neuralNet;
}